

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O0

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  bool bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  UInt UVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  Value *this;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ostream *this_00;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *this_01;
  reference pcVar9;
  const_iterator cVar10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  cmSourceReqInfo *provide_1;
  iterator __end4_2;
  iterator __begin4_2;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range4_2;
  undefined1 local_15f8 [7];
  bool is_interface_1;
  cmAlphaNum local_15c8;
  string local_1598;
  Value *local_1578;
  Value *is_interface_json;
  cmAlphaNum local_1540;
  string local_1510;
  basic_string_view<char,_std::char_traits<char>_> local_14f0;
  basic_string_view<char,_std::char_traits<char>_> local_14e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_14d0;
  basic_string_view<char,_std::char_traits<char>_> local_14c0;
  basic_string_view<char,_std::char_traits<char>_> local_14b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_14a0;
  basic_string_view<char,_std::char_traits<char>_> local_1490;
  basic_string_view<char,_std::char_traits<char>_> local_1480;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1470;
  undefined1 local_1460 [8];
  string lookup_method_str;
  cmAlphaNum local_1410;
  string local_13e0;
  Value *local_13c0;
  Value *lookup_method;
  cmAlphaNum local_1388;
  string local_1358;
  cmAlphaNum local_1338;
  cmAlphaNum local_1308;
  string local_12d8;
  cmAlphaNum local_12b8;
  cmAlphaNum local_1288;
  string local_1258;
  Value *local_1238;
  Value *source_path_1;
  cmAlphaNum local_1200;
  string local_11d0;
  Value *local_11b0;
  Value *unique_on_source_path_1;
  cmAlphaNum local_1178;
  string local_1148;
  cmAlphaNum local_1128;
  cmAlphaNum local_10f8;
  string local_10c8;
  Value *local_10a8;
  Value *compiled_module_path_1;
  cmAlphaNum local_1070;
  string local_1040;
  Value *local_1020;
  Value *logical_name_1;
  cmSourceReqInfo require_info;
  Value *require;
  undefined1 local_f98 [8];
  const_iterator __end4_1;
  undefined1 local_f78 [8];
  const_iterator __begin4_1;
  Value *__range4_1;
  cmAlphaNum local_f30;
  string local_f00;
  Value *local_ee0;
  Value *reqs;
  cmAlphaNum local_ea8;
  string local_e78;
  Value *local_e58;
  Value *is_interface;
  cmAlphaNum local_e20;
  string local_df0;
  cmAlphaNum local_dd0;
  cmAlphaNum local_da0;
  string local_d70;
  cmAlphaNum local_d50;
  cmAlphaNum local_d20;
  string local_cf0;
  Value *local_cd0;
  Value *source_path;
  cmAlphaNum local_c98;
  string local_c68;
  Value *local_c48;
  Value *unique_on_source_path;
  cmAlphaNum local_c10;
  string local_be0;
  cmAlphaNum local_bc0;
  cmAlphaNum local_b90;
  string local_b60;
  Value *local_b40;
  Value *compiled_module_path;
  cmAlphaNum local_b08;
  string local_ad8;
  Value *local_ab8;
  Value *logical_name;
  cmSourceReqInfo provide_info;
  Value *provide;
  undefined1 local_a30 [8];
  const_iterator __end4;
  undefined1 local_a10 [8];
  const_iterator __begin4;
  Value *__range4;
  cmAlphaNum local_9c8;
  string local_998;
  Value *local_978;
  Value *provides;
  cmAlphaNum local_940;
  string local_910;
  cmAlphaNum local_8f0;
  cmAlphaNum local_8c0;
  string local_890;
  undefined1 local_870 [8];
  string extra_output;
  Value *output;
  undefined1 local_838 [8];
  const_iterator __end5;
  undefined1 local_818 [8];
  const_iterator __begin5;
  Value *__range5;
  Value *outputs;
  cmAlphaNum local_7c8;
  string local_798;
  cmAlphaNum local_778;
  cmAlphaNum local_748;
  string local_718;
  Value *local_6f8;
  Value *primary_output;
  cmAlphaNum local_6c0;
  string local_690;
  cmAlphaNum local_670;
  cmAlphaNum local_640;
  string local_610;
  undefined1 local_5f0 [8];
  string wd;
  Value *workdir;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  Value *rule;
  undefined1 local_588 [8];
  const_iterator __end2;
  undefined1 local_568 [8];
  const_iterator __begin2;
  Value *__range2;
  cmAlphaNum local_520;
  string local_4f0;
  Value *local_4d0;
  Value *rules;
  cmAlphaNum local_4a8;
  cmAlphaNum local_478;
  string local_448;
  Value *local_428;
  Value *version;
  String local_418;
  cmAlphaNum local_3f8;
  cmAlphaNum local_3c8;
  string local_398;
  undefined1 local_378 [8];
  Reader reader;
  istream local_258 [8];
  ifstream ppf;
  Value *ppi;
  Value ppio;
  cmScanDepInfo *info_local;
  string *arg_pp_local;
  
  ppio.limit_ = (ptrdiff_t)info;
  Json::Value::Value((Value *)&ppi,nullValue);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_258,pcVar6,_Var3);
  Json::Reader::Reader((Reader *)local_378);
  bVar1 = Json::Reader::parse((Reader *)local_378,local_258,(Value *)&ppi,false);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_3c8,"-E cmake_ninja_dyndep failed to parse ");
    cmAlphaNum::cmAlphaNum(&local_3f8,arg_pp);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_418,(Reader *)local_378);
    cmStrCat<std::__cxx11::string>(&local_398,&local_3c8,&local_3f8,&local_418);
    cmSystemTools::Error(&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_418);
    arg_pp_local._7_1_ = 0;
  }
  version._4_4_ = (uint)!bVar1;
  Json::Reader::~Reader((Reader *)local_378);
  if (version._4_4_ == 0) {
    local_428 = Json::Value::operator[]((Value *)&ppi,"version");
    UVar4 = Json::Value::asUInt(local_428);
    if (UVar4 < 2) {
      local_4d0 = Json::Value::operator[]((Value *)&ppi,"rules");
      bVar1 = Json::Value::isArray(local_4d0);
      if (bVar1) {
        AVar5 = Json::Value::size(local_4d0);
        if (AVar5 != 1) {
          cmAlphaNum::cmAlphaNum(&local_520,"-E cmake_ninja_dyndep failed to parse ");
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range2,arg_pp);
          cmStrCat<char[26]>(&local_4f0,&local_520,(cmAlphaNum *)&__range2,
                             (char (*) [26])": expected 1 source entry");
          cmSystemTools::Error(&local_4f0);
          std::__cxx11::string::~string((string *)&local_4f0);
          arg_pp_local._7_1_ = 0;
          version._4_4_ = 1;
          goto LAB_0092db29;
        }
        __begin2.super_ValueIteratorBase._8_8_ = local_4d0;
        cVar10 = Json::Value::begin(local_4d0);
        __end2.super_ValueIteratorBase._8_8_ = cVar10.super_ValueIteratorBase.current_._M_node;
        __begin2.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar10.super_ValueIteratorBase.isNull_;
        local_568 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
        cVar10 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
        local_588 = (undefined1  [8])cVar10.super_ValueIteratorBase.current_._M_node;
        __end2.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar10.super_ValueIteratorBase.isNull_;
        while( true ) {
          bVar1 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)local_568,(SelfType *)local_588);
          if (!bVar1) break;
          work_directory.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = Json::ValueConstIterator::operator*((ValueConstIterator *)local_568);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&workdir);
          wd.field_2._8_8_ =
               Json::Value::operator[]
                         ((Value *)work_directory.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._32_8_,"work-directory");
          bVar1 = Json::Value::isString((Value *)wd.field_2._8_8_);
          if (bVar1) {
            std::__cxx11::string::string((string *)local_5f0);
            bVar1 = ParseFilename((Value *)wd.field_2._8_8_,(string *)local_5f0);
            if (bVar1) {
              std::optional<std::__cxx11::string>::operator=
                        ((optional<std::__cxx11::string> *)&workdir,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5f0);
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_640,"-E cmake_ninja_dyndep failed to parse ");
              cmAlphaNum::cmAlphaNum(&local_670,arg_pp);
              cmStrCat<char[15]>(&local_610,&local_640,&local_670,(char (*) [15])": invalid blob");
              cmSystemTools::Error(&local_610);
              std::__cxx11::string::~string((string *)&local_610);
              arg_pp_local._7_1_ = 0;
            }
            version._4_4_ = (uint)!bVar1;
            std::__cxx11::string::~string((string *)local_5f0);
            if (version._4_4_ == 0) goto LAB_0092bbc6;
          }
          else {
            bVar1 = Json::Value::isNull((Value *)wd.field_2._8_8_);
            if (bVar1) {
LAB_0092bbc6:
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"primary-output");
              if (bVar1) {
                local_6f8 = Json::Value::operator[]
                                      ((Value *)work_directory.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_8_,"primary-output");
                bVar1 = ParseFilename(local_6f8,(string *)ppio.limit_);
                if (!bVar1) {
                  cmAlphaNum::cmAlphaNum(&local_748,"-E cmake_ninja_dyndep failed to parse ");
                  cmAlphaNum::cmAlphaNum(&local_778,arg_pp);
                  cmStrCat<char[19]>(&local_718,&local_748,&local_778,
                                     (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&local_718);
                  std::__cxx11::string::~string((string *)&local_718);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_0092dade;
                }
                bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                if (bVar1) {
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&workdir);
                  uVar7 = std::__cxx11::string::empty();
                  if ((uVar7 & 1) == 0) {
                    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)ppio.limit_);
                    if (!bVar1) {
                      pbVar8 = std::
                               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&workdir);
                      cmAlphaNum::cmAlphaNum(&local_7c8,pbVar8);
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&outputs,'/');
                      cmStrCat<std::__cxx11::string>
                                (&local_798,&local_7c8,(cmAlphaNum *)&outputs,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ppio.limit_);
                      std::__cxx11::string::operator=((string *)ppio.limit_,(string *)&local_798);
                      std::__cxx11::string::~string((string *)&local_798);
                    }
                  }
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"outputs");
              if (bVar1) {
                this = Json::Value::operator[]
                                 ((Value *)work_directory.
                                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._32_8_,"outputs");
                bVar1 = Json::Value::isArray(this);
                if (bVar1) {
                  __begin5.super_ValueIteratorBase._8_8_ = this;
                  cVar10 = Json::Value::begin(this);
                  __end5.super_ValueIteratorBase._8_8_ =
                       cVar10.super_ValueIteratorBase.current_._M_node;
                  __begin5.super_ValueIteratorBase.current_._M_node._0_1_ =
                       cVar10.super_ValueIteratorBase.isNull_;
                  local_818 = (undefined1  [8])__end5.super_ValueIteratorBase._8_8_;
                  cVar10 = Json::Value::end((Value *)__begin5.super_ValueIteratorBase._8_8_);
                  local_838 = (undefined1  [8])cVar10.super_ValueIteratorBase.current_._M_node;
                  __end5.super_ValueIteratorBase.current_._M_node._0_1_ =
                       cVar10.super_ValueIteratorBase.isNull_;
                  while( true ) {
                    bVar1 = Json::ValueIteratorBase::operator!=
                                      ((ValueIteratorBase *)local_818,(SelfType *)local_838);
                    if (!bVar1) break;
                    extra_output.field_2._8_8_ =
                         Json::ValueConstIterator::operator*((ValueConstIterator *)local_818);
                    std::__cxx11::string::string((string *)local_870);
                    bVar1 = ParseFilename((Value *)extra_output.field_2._8_8_,(string *)local_870);
                    if (bVar1) {
                      bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                      if (bVar1) {
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&workdir);
                        uVar7 = std::__cxx11::string::empty();
                        if ((uVar7 & 1) == 0) {
                          bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_870);
                          if (!bVar1) {
                            pbVar8 = std::
                                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                            cmAlphaNum::cmAlphaNum(&local_940,pbVar8);
                            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&provides,'/');
                            cmStrCat<std::__cxx11::string>
                                      (&local_910,&local_940,(cmAlphaNum *)&provides,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_870);
                            std::__cxx11::string::operator=
                                      ((string *)local_870,(string *)&local_910);
                            std::__cxx11::string::~string((string *)&local_910);
                          }
                        }
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)(ppio.limit_ + 0x20),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_870);
                      version._4_4_ = 0;
                    }
                    else {
                      cmAlphaNum::cmAlphaNum(&local_8c0,"-E cmake_ninja_dyndep failed to parse ");
                      cmAlphaNum::cmAlphaNum(&local_8f0,arg_pp);
                      cmStrCat<char[19]>(&local_890,&local_8c0,&local_8f0,
                                         (char (*) [19])": invalid filename");
                      cmSystemTools::Error(&local_890);
                      std::__cxx11::string::~string((string *)&local_890);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                    std::__cxx11::string::~string((string *)local_870);
                    if (version._4_4_ != 0) goto LAB_0092dade;
                    Json::ValueConstIterator::operator++((ValueConstIterator *)local_818);
                  }
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"provides");
              if (bVar1) {
                local_978 = Json::Value::operator[]
                                      ((Value *)work_directory.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_8_,"provides");
                bVar1 = Json::Value::isArray(local_978);
                if (!bVar1) {
                  cmAlphaNum::cmAlphaNum(&local_9c8,"-E cmake_ninja_dyndep failed to parse ");
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range4,arg_pp);
                  cmStrCat<char[27]>(&local_998,&local_9c8,(cmAlphaNum *)&__range4,
                                     (char (*) [27])": provides is not an array");
                  cmSystemTools::Error(&local_998);
                  std::__cxx11::string::~string((string *)&local_998);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_0092dade;
                }
                __begin4.super_ValueIteratorBase._8_8_ = local_978;
                cVar10 = Json::Value::begin(local_978);
                __end4.super_ValueIteratorBase._8_8_ =
                     cVar10.super_ValueIteratorBase.current_._M_node;
                __begin4.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar10.super_ValueIteratorBase.isNull_;
                local_a10 = (undefined1  [8])__end4.super_ValueIteratorBase._8_8_;
                cVar10 = Json::Value::end((Value *)__begin4.super_ValueIteratorBase._8_8_);
                local_a30 = (undefined1  [8])cVar10.super_ValueIteratorBase.current_._M_node;
                __end4.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar10.super_ValueIteratorBase.isNull_;
                while( true ) {
                  bVar1 = Json::ValueIteratorBase::operator!=
                                    ((ValueIteratorBase *)local_a10,(SelfType *)local_a30);
                  if (!bVar1) break;
                  provide_info._96_8_ =
                       Json::ValueConstIterator::operator*((ValueConstIterator *)local_a10);
                  cmSourceReqInfo::cmSourceReqInfo((cmSourceReqInfo *)&logical_name);
                  local_ab8 = Json::Value::operator[]((Value *)provide_info._96_8_,"logical-name");
                  bVar1 = ParseFilename(local_ab8,(string *)&logical_name);
                  if (bVar1) {
                    bVar1 = Json::Value::isMember
                                      ((Value *)provide_info._96_8_,"compiled-module-path");
                    if (bVar1) {
                      local_b40 = Json::Value::operator[]
                                            ((Value *)provide_info._96_8_,"compiled-module-path");
                      bVar1 = ParseFilename(local_b40,
                                            (string *)((long)&provide_info.SourcePath.field_2 + 8));
                      if (!bVar1) {
                        cmAlphaNum::cmAlphaNum(&local_b90,"-E cmake_ninja_dyndep failed to parse ");
                        cmAlphaNum::cmAlphaNum(&local_bc0,arg_pp);
                        cmStrCat<char[19]>(&local_b60,&local_b90,&local_bc0,
                                           (char (*) [19])": invalid filename");
                        cmSystemTools::Error(&local_b60);
                        std::__cxx11::string::~string((string *)&local_b60);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_0092cb4e;
                      }
                      bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                      if (bVar1) {
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&workdir);
                        uVar7 = std::__cxx11::string::empty();
                        if ((uVar7 & 1) == 0) {
                          bVar1 = cmsys::SystemTools::FileIsFullPath
                                            ((string *)((long)&provide_info.SourcePath.field_2 + 8))
                          ;
                          if (!bVar1) {
                            pbVar8 = std::
                                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                            cmAlphaNum::cmAlphaNum(&local_c10,pbVar8);
                            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&unique_on_source_path,'/');
                            cmStrCat<std::__cxx11::string>
                                      (&local_be0,&local_c10,(cmAlphaNum *)&unique_on_source_path,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&provide_info.SourcePath.field_2 + 8));
                            std::__cxx11::string::operator=
                                      ((string *)(provide_info.SourcePath.field_2._M_local_buf + 8),
                                       (string *)&local_be0);
                            std::__cxx11::string::~string((string *)&local_be0);
                          }
                        }
                      }
                    }
                    bVar1 = Json::Value::isMember
                                      ((Value *)provide_info._96_8_,"unique-on-source-path");
                    if (bVar1) {
                      local_c48 = Json::Value::operator[]
                                            ((Value *)provide_info._96_8_,"unique-on-source-path");
                      bVar1 = Json::Value::isBool(local_c48);
                      if (!bVar1) {
                        cmAlphaNum::cmAlphaNum(&local_c98,"-E cmake_ninja_dyndep failed to parse ");
                        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&source_path,arg_pp);
                        cmStrCat<char[41]>(&local_c68,&local_c98,(cmAlphaNum *)&source_path,
                                           (char (*) [41])": unique-on-source-path is not a boolean"
                                          );
                        cmSystemTools::Error(&local_c68);
                        std::__cxx11::string::~string((string *)&local_c68);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_0092cb4e;
                      }
                      provide_info.CompiledModulePath.field_2._M_local_buf[8] =
                           Json::Value::asBool(local_c48);
                    }
                    else {
                      provide_info.CompiledModulePath.field_2._M_local_buf[8] = '\0';
                    }
                    bVar1 = Json::Value::isMember((Value *)provide_info._96_8_,"source-path");
                    if (bVar1) {
                      local_cd0 = Json::Value::operator[]
                                            ((Value *)provide_info._96_8_,"source-path");
                      bVar1 = ParseFilename(local_cd0,
                                            (string *)((long)&provide_info.LogicalName.field_2 + 8))
                      ;
                      if (bVar1) {
                        bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                        if (bVar1) {
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&workdir);
                          uVar7 = std::__cxx11::string::empty();
                          if ((uVar7 & 1) == 0) {
                            bVar1 = cmsys::SystemTools::FileIsFullPath
                                              ((string *)
                                               ((long)&provide_info.LogicalName.field_2 + 8));
                            if (!bVar1) {
                              pbVar8 = std::
                                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::operator*((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                              cmAlphaNum::cmAlphaNum(&local_da0,pbVar8);
                              cmAlphaNum::cmAlphaNum(&local_dd0,'/');
                              cmStrCat<std::__cxx11::string>
                                        (&local_d70,&local_da0,&local_dd0,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&provide_info.LogicalName.field_2 + 8));
                              std::__cxx11::string::operator=
                                        ((string *)
                                         (provide_info.LogicalName.field_2._M_local_buf + 8),
                                         (string *)&local_d70);
                              std::__cxx11::string::~string((string *)&local_d70);
                            }
                          }
                        }
                        goto LAB_0092c9f7;
                      }
                      cmAlphaNum::cmAlphaNum(&local_d20,"-E cmake_ninja_dyndep failed to parse ");
                      cmAlphaNum::cmAlphaNum(&local_d50,arg_pp);
                      cmStrCat<char[19]>(&local_cf0,&local_d20,&local_d50,
                                         (char (*) [19])": invalid filename");
                      cmSystemTools::Error(&local_cf0);
                      std::__cxx11::string::~string((string *)&local_cf0);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                    else if ((provide_info.CompiledModulePath.field_2._M_local_buf[8] & 1U) == 0) {
LAB_0092c9f7:
                      bVar1 = Json::Value::isMember((Value *)provide_info._96_8_,"is-interface");
                      if (bVar1) {
                        local_e58 = Json::Value::operator[]
                                              ((Value *)provide_info._96_8_,"is-interface");
                        bVar1 = Json::Value::isBool(local_e58);
                        if (!bVar1) {
                          cmAlphaNum::cmAlphaNum
                                    (&local_ea8,"-E cmake_ninja_dyndep failed to parse ");
                          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&reqs,arg_pp);
                          cmStrCat<char[32]>(&local_e78,&local_ea8,(cmAlphaNum *)&reqs,
                                             (char (*) [32])": is-interface is not a boolean");
                          cmSystemTools::Error(&local_e78);
                          std::__cxx11::string::~string((string *)&local_e78);
                          arg_pp_local._7_1_ = 0;
                          version._4_4_ = 1;
                          goto LAB_0092cb4e;
                        }
                        provide_info.CompiledModulePath.field_2._M_local_buf[9] =
                             Json::Value::asBool(local_e58);
                      }
                      else {
                        provide_info.CompiledModulePath.field_2._M_local_buf[9] = '\x01';
                      }
                      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                                ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)
                                 (ppio.limit_ + 0x38),(value_type *)&logical_name);
                      version._4_4_ = 0;
                    }
                    else {
                      cmAlphaNum::cmAlphaNum(&local_e20,"-E cmake_ninja_dyndep failed to parse ");
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&is_interface,arg_pp);
                      cmStrCat<char[25]>(&local_df0,&local_e20,(cmAlphaNum *)&is_interface,
                                         (char (*) [25])": source-path is missing");
                      cmSystemTools::Error(&local_df0);
                      std::__cxx11::string::~string((string *)&local_df0);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                  }
                  else {
                    cmAlphaNum::cmAlphaNum(&local_b08,"-E cmake_ninja_dyndep failed to parse ");
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&compiled_module_path,arg_pp);
                    cmStrCat<char[15]>(&local_ad8,&local_b08,(cmAlphaNum *)&compiled_module_path,
                                       (char (*) [15])": invalid blob");
                    cmSystemTools::Error(&local_ad8);
                    std::__cxx11::string::~string((string *)&local_ad8);
                    arg_pp_local._7_1_ = 0;
                    version._4_4_ = 1;
                  }
LAB_0092cb4e:
                  cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&logical_name);
                  if (version._4_4_ != 0) goto LAB_0092dade;
                  Json::ValueConstIterator::operator++((ValueConstIterator *)local_a10);
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"requires");
              if (bVar1) {
                local_ee0 = Json::Value::operator[]
                                      ((Value *)work_directory.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_8_,"requires");
                bVar1 = Json::Value::isArray(local_ee0);
                if (!bVar1) {
                  cmAlphaNum::cmAlphaNum(&local_f30,"-E cmake_ninja_dyndep failed to parse ");
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range4_1,arg_pp);
                  cmStrCat<char[27]>(&local_f00,&local_f30,(cmAlphaNum *)&__range4_1,
                                     (char (*) [27])": requires is not an array");
                  cmSystemTools::Error(&local_f00);
                  std::__cxx11::string::~string((string *)&local_f00);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_0092dade;
                }
                __begin4_1.super_ValueIteratorBase._8_8_ = local_ee0;
                cVar10 = Json::Value::begin(local_ee0);
                __end4_1.super_ValueIteratorBase._8_8_ =
                     cVar10.super_ValueIteratorBase.current_._M_node;
                __begin4_1.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar10.super_ValueIteratorBase.isNull_;
                local_f78 = (undefined1  [8])__end4_1.super_ValueIteratorBase._8_8_;
                cVar10 = Json::Value::end((Value *)__begin4_1.super_ValueIteratorBase._8_8_);
                local_f98 = (undefined1  [8])cVar10.super_ValueIteratorBase.current_._M_node;
                __end4_1.super_ValueIteratorBase.current_._M_node._0_1_ =
                     cVar10.super_ValueIteratorBase.isNull_;
                while( true ) {
                  bVar1 = Json::ValueIteratorBase::operator!=
                                    ((ValueIteratorBase *)local_f78,(SelfType *)local_f98);
                  if (!bVar1) break;
                  require_info._96_8_ =
                       Json::ValueConstIterator::operator*((ValueConstIterator *)local_f78);
                  cmSourceReqInfo::cmSourceReqInfo((cmSourceReqInfo *)&logical_name_1);
                  local_1020 = Json::Value::operator[]((Value *)require_info._96_8_,"logical-name");
                  bVar1 = ParseFilename(local_1020,(string *)&logical_name_1);
                  if (bVar1) {
                    bVar1 = Json::Value::isMember
                                      ((Value *)require_info._96_8_,"compiled-module-path");
                    if (bVar1) {
                      local_10a8 = Json::Value::operator[]
                                             ((Value *)require_info._96_8_,"compiled-module-path");
                      bVar1 = ParseFilename(local_10a8,
                                            (string *)((long)&require_info.SourcePath.field_2 + 8));
                      if (!bVar1) {
                        cmAlphaNum::cmAlphaNum(&local_10f8,"-E cmake_ninja_dyndep failed to parse ")
                        ;
                        cmAlphaNum::cmAlphaNum(&local_1128,arg_pp);
                        cmStrCat<char[19]>(&local_10c8,&local_10f8,&local_1128,
                                           (char (*) [19])": invalid filename");
                        cmSystemTools::Error(&local_10c8);
                        std::__cxx11::string::~string((string *)&local_10c8);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_0092d8a7;
                      }
                      bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                      if (bVar1) {
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&workdir);
                        uVar7 = std::__cxx11::string::empty();
                        if ((uVar7 & 1) == 0) {
                          bVar1 = cmsys::SystemTools::FileIsFullPath
                                            ((string *)((long)&require_info.SourcePath.field_2 + 8))
                          ;
                          if (!bVar1) {
                            pbVar8 = std::
                                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                            cmAlphaNum::cmAlphaNum(&local_1178,pbVar8);
                            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&unique_on_source_path_1,'/');
                            cmStrCat<std::__cxx11::string>
                                      (&local_1148,&local_1178,
                                       (cmAlphaNum *)&unique_on_source_path_1,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&require_info.SourcePath.field_2 + 8));
                            std::__cxx11::string::operator=
                                      ((string *)(require_info.SourcePath.field_2._M_local_buf + 8),
                                       (string *)&local_1148);
                            std::__cxx11::string::~string((string *)&local_1148);
                          }
                        }
                      }
                    }
                    bVar1 = Json::Value::isMember
                                      ((Value *)require_info._96_8_,"unique-on-source-path");
                    if (bVar1) {
                      local_11b0 = Json::Value::operator[]
                                             ((Value *)require_info._96_8_,"unique-on-source-path");
                      bVar1 = Json::Value::isBool(local_11b0);
                      if (!bVar1) {
                        cmAlphaNum::cmAlphaNum(&local_1200,"-E cmake_ninja_dyndep failed to parse ")
                        ;
                        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&source_path_1,arg_pp);
                        cmStrCat<char[41]>(&local_11d0,&local_1200,(cmAlphaNum *)&source_path_1,
                                           (char (*) [41])": unique-on-source-path is not a boolean"
                                          );
                        cmSystemTools::Error(&local_11d0);
                        std::__cxx11::string::~string((string *)&local_11d0);
                        arg_pp_local._7_1_ = 0;
                        version._4_4_ = 1;
                        goto LAB_0092d8a7;
                      }
                      require_info.CompiledModulePath.field_2._M_local_buf[8] =
                           Json::Value::asBool(local_11b0);
                    }
                    else {
                      require_info.CompiledModulePath.field_2._M_local_buf[8] = '\0';
                    }
                    bVar1 = Json::Value::isMember((Value *)require_info._96_8_,"source-path");
                    if (bVar1) {
                      local_1238 = Json::Value::operator[]
                                             ((Value *)require_info._96_8_,"source-path");
                      bVar1 = ParseFilename(local_1238,
                                            (string *)((long)&require_info.LogicalName.field_2 + 8))
                      ;
                      if (bVar1) {
                        bVar1 = std::optional::operator_cast_to_bool((optional *)&workdir);
                        if (bVar1) {
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&workdir);
                          uVar7 = std::__cxx11::string::empty();
                          if ((uVar7 & 1) == 0) {
                            bVar1 = cmsys::SystemTools::FileIsFullPath
                                              ((string *)
                                               ((long)&require_info.LogicalName.field_2 + 8));
                            if (!bVar1) {
                              pbVar8 = std::
                                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::operator*((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&workdir);
                              cmAlphaNum::cmAlphaNum(&local_1308,pbVar8);
                              cmAlphaNum::cmAlphaNum(&local_1338,'/');
                              cmStrCat<std::__cxx11::string>
                                        (&local_12d8,&local_1308,&local_1338,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&require_info.LogicalName.field_2 + 8));
                              std::__cxx11::string::operator=
                                        ((string *)
                                         (require_info.LogicalName.field_2._M_local_buf + 8),
                                         (string *)&local_12d8);
                              std::__cxx11::string::~string((string *)&local_12d8);
                            }
                          }
                        }
                        goto LAB_0092d468;
                      }
                      cmAlphaNum::cmAlphaNum(&local_1288,"-E cmake_ninja_dyndep failed to parse ");
                      cmAlphaNum::cmAlphaNum(&local_12b8,arg_pp);
                      cmStrCat<char[19]>(&local_1258,&local_1288,&local_12b8,
                                         (char (*) [19])": invalid filename");
                      cmSystemTools::Error(&local_1258);
                      std::__cxx11::string::~string((string *)&local_1258);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                    else if ((require_info.CompiledModulePath.field_2._M_local_buf[8] & 1U) == 0) {
LAB_0092d468:
                      bVar1 = Json::Value::isMember((Value *)require_info._96_8_,"lookup-method");
                      if (bVar1) {
                        local_13c0 = Json::Value::operator[]
                                               ((Value *)require_info._96_8_,"lookup-method");
                        bVar1 = Json::Value::isString(local_13c0);
                        if (!bVar1) {
                          cmAlphaNum::cmAlphaNum
                                    (&local_1410,"-E cmake_ninja_dyndep failed to parse ");
                          cmAlphaNum::cmAlphaNum
                                    ((cmAlphaNum *)((long)&lookup_method_str.field_2 + 8),arg_pp);
                          cmStrCat<char[32]>(&local_13e0,&local_1410,
                                             (cmAlphaNum *)((long)&lookup_method_str.field_2 + 8),
                                             (char (*) [32])": lookup-method is not a string");
                          cmSystemTools::Error(&local_13e0);
                          std::__cxx11::string::~string((string *)&local_13e0);
                          arg_pp_local._7_1_ = 0;
                          version._4_4_ = 1;
                          goto LAB_0092d8a7;
                        }
                        Json::Value::asString_abi_cxx11_((String *)local_1460,local_13c0);
                        _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                 std::__cxx11::string::operator_cast_to_basic_string_view
                                           ((string *)local_1460);
                        local_1470 = _Var11;
                        bVar12 = (basic_string_view<char,_std::char_traits<char>_>)
                                 cm::operator____s("by-name",7);
                        local_1490 = bVar12;
                        local_1480 = bVar12;
                        bVar1 = std::operator==(local_1470,bVar12);
                        if (bVar1) {
                          require_info.CompiledModulePath.field_2._12_4_ = 0;
LAB_0092d840:
                          version._4_4_ = 0;
                        }
                        else {
                          _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                   std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)local_1460);
                          local_14a0 = _Var11;
                          bVar12 = (basic_string_view<char,_std::char_traits<char>_>)
                                   cm::operator____s("include-angle",0xd);
                          local_14c0 = bVar12;
                          local_14b0 = bVar12;
                          bVar1 = std::operator==(local_14a0,bVar12);
                          if (bVar1) {
                            require_info.CompiledModulePath.field_2._12_4_ = 1;
                            goto LAB_0092d840;
                          }
                          _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                   std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)local_1460);
                          local_14d0 = _Var11;
                          bVar12 = (basic_string_view<char,_std::char_traits<char>_>)
                                   cm::operator____s("include-quote",0xd);
                          local_14f0 = bVar12;
                          local_14e0 = bVar12;
                          bVar1 = std::operator==(local_14d0,bVar12);
                          if (bVar1) {
                            require_info.CompiledModulePath.field_2._12_4_ = 2;
                            goto LAB_0092d840;
                          }
                          cmAlphaNum::cmAlphaNum
                                    (&local_1540,"-E cmake_ninja_dyndep failed to parse ");
                          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&is_interface_json,arg_pp);
                          cmStrCat<char[33],std::__cxx11::string>
                                    (&local_1510,&local_1540,(cmAlphaNum *)&is_interface_json,
                                     (char (*) [33])": lookup-method is not a valid: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1460);
                          cmSystemTools::Error(&local_1510);
                          std::__cxx11::string::~string((string *)&local_1510);
                          arg_pp_local._7_1_ = 0;
                          version._4_4_ = 1;
                        }
                        std::__cxx11::string::~string((string *)local_1460);
                        if (version._4_4_ != 0) goto LAB_0092d8a7;
                      }
                      else if ((require_info.CompiledModulePath.field_2._M_local_buf[8] & 1U) != 0)
                      {
                        require_info.CompiledModulePath.field_2._12_4_ = 0;
                      }
                      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                                ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)
                                 (ppio.limit_ + 0x50),(value_type *)&logical_name_1);
                      version._4_4_ = 0;
                    }
                    else {
                      cmAlphaNum::cmAlphaNum(&local_1388,"-E cmake_ninja_dyndep failed to parse ");
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&lookup_method,arg_pp);
                      cmStrCat<char[25]>(&local_1358,&local_1388,(cmAlphaNum *)&lookup_method,
                                         (char (*) [25])": source-path is missing");
                      cmSystemTools::Error(&local_1358);
                      std::__cxx11::string::~string((string *)&local_1358);
                      arg_pp_local._7_1_ = 0;
                      version._4_4_ = 1;
                    }
                  }
                  else {
                    cmAlphaNum::cmAlphaNum(&local_1070,"-E cmake_ninja_dyndep failed to parse ");
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&compiled_module_path_1,arg_pp);
                    cmStrCat<char[15]>(&local_1040,&local_1070,(cmAlphaNum *)&compiled_module_path_1
                                       ,(char (*) [15])": invalid blob");
                    cmSystemTools::Error(&local_1040);
                    std::__cxx11::string::~string((string *)&local_1040);
                    arg_pp_local._7_1_ = 0;
                    version._4_4_ = 1;
                  }
LAB_0092d8a7:
                  cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&logical_name_1);
                  if (version._4_4_ != 0) goto LAB_0092dade;
                  Json::ValueConstIterator::operator++((ValueConstIterator *)local_f78);
                }
              }
              bVar1 = Json::Value::isMember
                                ((Value *)work_directory.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._32_8_,"is-interface");
              if (bVar1) {
                this_00 = std::operator<<((ostream *)&std::cerr,
                                          "warning: acknowledging an VS 17.3 toolchain bug; accepting until a new release which fixes it is available"
                                         );
                std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
                local_1578 = Json::Value::operator[]
                                       ((Value *)work_directory.
                                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                 ._M_payload.
                                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                 .
                                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 ._32_8_,"is-interface");
                bVar1 = Json::Value::isBool(local_1578);
                if (!bVar1) {
                  cmAlphaNum::cmAlphaNum(&local_15c8,"-E cmake_ninja_dyndep failed to parse ");
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_15f8,arg_pp);
                  cmStrCat<char[32]>(&local_1598,&local_15c8,(cmAlphaNum *)local_15f8,
                                     (char (*) [32])": is-interface is not a boolean");
                  cmSystemTools::Error(&local_1598);
                  std::__cxx11::string::~string((string *)&local_1598);
                  arg_pp_local._7_1_ = 0;
                  version._4_4_ = 1;
                  goto LAB_0092dade;
                }
                bVar1 = Json::Value::asBool(local_1578);
                this_01 = (vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)
                          (ppio.limit_ + 0x38);
                __end4_2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                                     (this_01);
                provide_1 = (cmSourceReqInfo *)
                            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end
                                      (this_01);
                while( true ) {
                  bVar2 = __gnu_cxx::operator!=
                                    (&__end4_2,
                                     (__normal_iterator<cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                      *)&provide_1);
                  if (!bVar2) break;
                  pcVar9 = __gnu_cxx::
                           __normal_iterator<cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                           ::operator*(&__end4_2);
                  pcVar9->IsInterface = bVar1;
                  __gnu_cxx::
                  __normal_iterator<cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                  ::operator++(&__end4_2);
                }
              }
              version._4_4_ = 0;
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_6c0,"-E cmake_ninja_dyndep failed to parse ");
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)&primary_output,arg_pp);
              cmStrCat<char[33]>(&local_690,&local_6c0,(cmAlphaNum *)&primary_output,
                                 (char (*) [33])": work-directory is not a string");
              cmSystemTools::Error(&local_690);
              std::__cxx11::string::~string((string *)&local_690);
              arg_pp_local._7_1_ = 0;
              version._4_4_ = 1;
            }
          }
LAB_0092dade:
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&workdir);
          if (version._4_4_ != 0) goto LAB_0092db29;
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_568);
        }
      }
      arg_pp_local._7_1_ = 1;
      version._4_4_ = 1;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_478,"-E cmake_ninja_dyndep failed to parse ");
      cmAlphaNum::cmAlphaNum(&local_4a8,arg_pp);
      Json::Value::asString_abi_cxx11_((String *)&rules,local_428);
      cmStrCat<char[11],std::__cxx11::string>
                (&local_448,&local_478,&local_4a8,(char (*) [11])": version ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rules);
      cmSystemTools::Error(&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&rules);
      arg_pp_local._7_1_ = 0;
      version._4_4_ = 1;
    }
  }
LAB_0092db29:
  std::ifstream::~ifstream(local_258);
  Json::Value::~Value((Value *)&ppi);
  return (bool)(arg_pp_local._7_1_ & 1);
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }

      // MSVC 17.3 toolchain bug. Remove when 17.4 is available.
      if (rule.isMember("is-interface")) {
        std::cerr
          << "warning: acknowledging an VS 17.3 toolchain bug; accepting "
             "until a new release which fixes it is available"
          << std::endl;

        Json::Value const& is_interface_json = rule["is-interface"];
        if (!is_interface_json.isBool()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": is-interface is not a boolean"));
          return false;
        }
        bool is_interface = is_interface_json.asBool();

        for (auto& provide : info->Provides) {
          provide.IsInterface = is_interface;
        }
      }
    }
  }

  return true;
}